

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

timediff_t Curl_timeleft(Curl_easy *data,curltime *nowp,_Bool duringconnect)

{
  uint uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  timediff_t tVar10;
  curltime cVar11;
  curltime newer;
  curltime older;
  curltime older_00;
  Curl_easy *local_80;
  uint local_6c;
  timediff_t ctimeout_ms;
  undefined4 uStack_4c;
  undefined1 local_48 [8];
  curltime now;
  timediff_t ctimeleft_ms;
  timediff_t timeleft_ms;
  curltime *pcStack_20;
  _Bool duringconnect_local;
  curltime *nowp_local;
  Curl_easy *data_local;
  
  ctimeleft_ms = 0;
  now.tv_usec = 0;
  now._12_4_ = 0;
  if (((data->set).timeout != 0) || (duringconnect)) {
    pcStack_20 = nowp;
    if (nowp == (curltime *)0x0) {
      cVar11 = Curl_now();
      local_48 = (undefined1  [8])cVar11.tv_sec;
      now.tv_sec = CONCAT44(uStack_4c,cVar11.tv_usec);
      pcStack_20 = (curltime *)local_48;
    }
    if ((data->set).timeout != 0) {
      uVar1 = (data->set).timeout;
      uVar2 = pcStack_20->tv_sec;
      uVar3 = pcStack_20->tv_usec;
      cVar11.tv_usec = uVar3;
      cVar11.tv_sec = uVar2;
      uVar4 = (data->progress).t_startop.tv_sec;
      uVar5 = (data->progress).t_startop.tv_usec;
      older.tv_usec = uVar5;
      older.tv_sec = uVar4;
      cVar11._12_4_ = 0;
      older._12_4_ = 0;
      tVar10 = Curl_timediff(cVar11,older);
      ctimeleft_ms = (ulong)uVar1 - tVar10;
      if (ctimeleft_ms == 0) {
        ctimeleft_ms = -1;
      }
      if (!duringconnect) {
        return ctimeleft_ms;
      }
    }
    if (duringconnect) {
      if ((data->set).connecttimeout == 0) {
        local_6c = 300000;
      }
      else {
        local_6c = (data->set).connecttimeout;
      }
      uVar6 = pcStack_20->tv_sec;
      uVar7 = pcStack_20->tv_usec;
      newer.tv_usec = uVar7;
      newer.tv_sec = uVar6;
      uVar8 = (data->progress).t_startsingle.tv_sec;
      uVar9 = (data->progress).t_startsingle.tv_usec;
      older_00.tv_usec = uVar9;
      older_00.tv_sec = uVar8;
      newer._12_4_ = 0;
      older_00._12_4_ = 0;
      tVar10 = Curl_timediff(newer,older_00);
      now._8_8_ = (ulong)local_6c - tVar10;
      if (now._8_8_ == 0) {
        now.tv_usec = -1;
        now._12_4_ = 0xffffffff;
      }
      if (ctimeleft_ms == 0) {
        return now._8_8_;
      }
    }
    if ((long)now._8_8_ < ctimeleft_ms) {
      local_80 = (Curl_easy *)now._8_8_;
    }
    else {
      local_80 = (Curl_easy *)ctimeleft_ms;
    }
    data_local = local_80;
  }
  else {
    data_local = (Curl_easy *)0x0;
  }
  return (timediff_t)data_local;
}

Assistant:

timediff_t Curl_timeleft(struct Curl_easy *data,
                         struct curltime *nowp,
                         bool duringconnect)
{
  timediff_t timeleft_ms = 0;
  timediff_t ctimeleft_ms = 0;
  struct curltime now;

  /* The duration of a connect and the total transfer are calculated from two
     different time-stamps. It can end up with the total timeout being reached
     before the connect timeout expires and we must acknowledge whichever
     timeout that is reached first. The total timeout is set per entire
     operation, while the connect timeout is set per connect. */
  if(data->set.timeout <= 0 && !duringconnect)
    return 0; /* no timeout in place or checked, return "no limit" */

  if(!nowp) {
    now = Curl_now();
    nowp = &now;
  }

  if(data->set.timeout > 0) {
    timeleft_ms = data->set.timeout -
                  Curl_timediff(*nowp, data->progress.t_startop);
    if(!timeleft_ms)
      timeleft_ms = -1; /* 0 is "no limit", fake 1 ms expiry */
    if(!duringconnect)
      return timeleft_ms; /* no connect check, this is it */
  }

  if(duringconnect) {
    timediff_t ctimeout_ms = (data->set.connecttimeout > 0) ?
      data->set.connecttimeout : DEFAULT_CONNECT_TIMEOUT;
    ctimeleft_ms = ctimeout_ms -
                   Curl_timediff(*nowp, data->progress.t_startsingle);
    if(!ctimeleft_ms)
      ctimeleft_ms = -1; /* 0 is "no limit", fake 1 ms expiry */
    if(!timeleft_ms)
      return ctimeleft_ms; /* no general timeout, this is it */
  }
  /* return minimal time left or max amount already expired */
  return (ctimeleft_ms < timeleft_ms)? ctimeleft_ms : timeleft_ms;
}